

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

AtomicRMWInst * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::AtomicRMWInst,LLVMBC::Type*,LLVMBC::Value*&,LLVMBC::Value*&,LLVMBC::AtomicRMWInst::BinOp&>
          (LLVMContext *this,Type **u,Value **u_1,Value **u_2,BinOp *u_3)

{
  AtomicRMWInst *this_00;
  
  this_00 = (AtomicRMWInst *)allocate(this,0x88,8);
  if (this_00 != (AtomicRMWInst *)0x0) {
    AtomicRMWInst::AtomicRMWInst(this_00,*u,*u_1,*u_2,*u_3);
    append_typed_destructor<LLVMBC::AtomicRMWInst>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}